

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

obj * find_oid(level *lev,uint id)

{
  xchar xVar1;
  obj *poVar2;
  monst **ppmVar3;
  long lVar4;
  
  if ((lev != (level *)0x0) && (poVar2 = find_oid_lev(lev,id), poVar2 != (obj *)0x0)) {
    return poVar2;
  }
  poVar2 = o_on(id,invent);
  if (poVar2 != (obj *)0x0) {
    return poVar2;
  }
  poVar2 = o_on(id,magic_chest_objs);
  if (poVar2 != (obj *)0x0) {
    return poVar2;
  }
  ppmVar3 = &migrating_mons;
  do {
    ppmVar3 = &((monst *)ppmVar3)->nmon->nmon;
    if ((monst *)ppmVar3 == (monst *)0x0) {
      ppmVar3 = &mydogs;
      do {
        ppmVar3 = &((monst *)ppmVar3)->nmon->nmon;
        if ((monst *)ppmVar3 == (monst *)0x0) {
          xVar1 = maxledgerno();
          if (xVar1 < '\0') {
            return (obj *)0x0;
          }
          lVar4 = -1;
          while ((levels[lVar4 + 1] == (level *)0x0 ||
                 (poVar2 = find_oid_lev(levels[lVar4 + 1],id), poVar2 == (obj *)0x0))) {
            xVar1 = maxledgerno();
            lVar4 = lVar4 + 1;
            if (xVar1 <= lVar4) {
              return (obj *)0x0;
            }
          }
          return poVar2;
        }
        poVar2 = o_on(id,((monst *)ppmVar3)->minvent);
      } while (poVar2 == (obj *)0x0);
      return poVar2;
    }
    poVar2 = o_on(id,((monst *)ppmVar3)->minvent);
  } while (poVar2 == (obj *)0x0);
  return poVar2;
}

Assistant:

struct obj *find_oid(struct level *lev, unsigned id)
{
	struct obj *obj;
	struct monst *mon;
	int i;

	/* try searching the current level, if any */
	if (lev && (obj = find_oid_lev(lev, id))) return obj;

	/* first check various obj lists directly */
	if ((obj = o_on(id, invent))) return obj;
	if ((obj = o_on(id, magic_chest_objs))) return obj;

	/* not found yet; check inventory for members of various monst lists */
	for (mon = migrating_mons; mon; mon = mon->nmon)
	    if ((obj = o_on(id, mon->minvent))) return obj;
	for (mon = mydogs; mon; mon = mon->nmon)
	    if ((obj = o_on(id, mon->minvent))) return obj;

	/* search all levels */
	for (i = 0; i <= maxledgerno(); i++)
	    if (levels[i] && (obj = find_oid_lev(levels[i], id))) return obj;

	/* not found at all */
	return NULL;
}